

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idhash.c
# Opt level: O2

int id_resize(nni_id_map *m)

{
  nni_id_entry *pnVar1;
  nni_id_entry *ptr;
  uint uVar2;
  bool bVar3;
  uint uVar4;
  nni_id_map **__dest;
  long lVar5;
  nni_id_entry *pnVar6;
  void *pvVar7;
  ulong uVar8;
  uint64_t uVar9;
  uint32_t uVar10;
  ulong uVar11;
  ulong uVar12;
  nni_id_entry *pnVar13;
  int iVar14;
  
  if ((m->id_load < m->id_max_load) && (m->id_min_load <= m->id_load)) {
    return 0;
  }
  if ((m->id_flags & 5) != 1) goto LAB_001138d4;
  nni_mtx_lock(&id_reg_mtx);
  __dest = id_reg_map;
  if (id_reg_num < id_reg_len) {
LAB_001138a6:
    id_reg_map = __dest;
    lVar5 = (long)id_reg_num;
    id_reg_num = id_reg_num + 1;
    id_reg_map[lVar5] = m;
    *(byte *)&m->id_flags = (byte)m->id_flags | 4;
    iVar14 = 0;
    bVar3 = true;
  }
  else {
    uVar11 = 10;
    if (9 < id_reg_len) {
      uVar11 = (ulong)(uint)(id_reg_len * 2);
    }
    __dest = (nni_id_map **)nni_zalloc(uVar11 * 8);
    iVar14 = id_reg_num;
    if (__dest != (nni_id_map **)0x0) {
      id_reg_len = (int)uVar11;
      id_reg_num = iVar14;
      if (id_reg_map != (nni_id_map **)0x0) {
        memcpy(__dest,id_reg_map,(long)id_reg_num << 3);
        id_reg_num = iVar14;
      }
      goto LAB_001138a6;
    }
    iVar14 = 2;
    bVar3 = false;
  }
  nni_mtx_unlock(&id_reg_mtx);
  if (!bVar3) {
    return iVar14;
  }
LAB_001138d4:
  uVar8 = (ulong)m->id_cap;
  uVar11 = 8;
  do {
    uVar12 = uVar11;
    uVar2 = (uint)uVar12;
    uVar11 = (ulong)(uVar2 * 2);
  } while (uVar2 < m->id_count * 2);
  if (uVar2 == m->id_cap) {
    return 0;
  }
  ptr = m->id_entries;
  pnVar6 = (nni_id_entry *)nni_zalloc(uVar12 * 0x18);
  if (pnVar6 == (nni_id_entry *)0x0) {
    return 2;
  }
  m->id_entries = pnVar6;
  m->id_cap = uVar2;
  m->id_load = 0;
  if (uVar2 < 9) {
    uVar4 = 5;
    uVar10 = 0;
  }
  else {
    uVar10 = (uint32_t)(uVar12 >> 3);
    uVar4 = (uVar2 * 2) / 3;
  }
  m->id_min_load = uVar10;
  m->id_max_load = uVar4;
  for (uVar11 = 0; uVar11 != uVar8; uVar11 = uVar11 + 1) {
    pvVar7 = ptr[uVar11].val;
    if (pvVar7 != (void *)0x0) {
      pnVar13 = ptr + uVar11;
      uVar9 = pnVar13->key;
      uVar4 = (uint)uVar9 & uVar2 - 1;
      uVar10 = m->id_load;
      while( true ) {
        uVar10 = uVar10 + 1;
        pnVar1 = pnVar6 + uVar4;
        if (pnVar6[uVar4].val == (void *)0x0) break;
        pnVar1->skips = pnVar1->skips + 1;
        uVar4 = m->id_cap - 1 & uVar4 * 5 + 1;
      }
      m->id_load = uVar10;
      if (pnVar1->skips != 0) {
        nni_panic("%s: %d: assert err: %s",
                  "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/idhash.c"
                  ,0xdd,"new_entries[index].skips == 0");
        uVar9 = pnVar13->key;
        pvVar7 = pnVar13->val;
      }
      pnVar1->val = pvVar7;
      pnVar1->key = uVar9;
    }
  }
  if (uVar8 != 0) {
    nni_free(ptr,uVar8 * 0x18);
    return 0;
  }
  return 0;
}

Assistant:

static int
id_resize(nni_id_map *m)
{
	nni_id_entry *new_entries;
	nni_id_entry *old_entries;
	uint32_t      new_cap;
	uint32_t      old_cap;
	uint32_t      i;
	int           rv;

	if ((m->id_load < m->id_max_load) && (m->id_load >= m->id_min_load)) {
		// No resize needed.
		return (0);
	}

	// if it is a statically declared map, register it so that we
	// will free it at finalization time
	if ((rv = id_map_register(m)) != 0) {
		return (rv);
	}

	old_cap = m->id_cap;
	new_cap = 8;
	while (new_cap < (m->id_count * 2)) {
		new_cap *= 2;
	}
	if (new_cap == old_cap) {
		// Same size.
		return (0);
	}

	old_entries = m->id_entries;
	new_entries = NNI_ALLOC_STRUCTS(new_entries, new_cap);
	if (new_entries == NULL) {
		return (NNG_ENOMEM);
	}

	m->id_entries = new_entries;
	m->id_cap     = new_cap;
	m->id_load    = 0;
	if (new_cap > 8) {
		m->id_min_load = new_cap / 8;
		m->id_max_load = new_cap * 2 / 3;
	} else {
		m->id_min_load = 0;
		m->id_max_load = 5;
	}
	for (i = 0; i < old_cap; i++) {
		size_t index;
		if (old_entries[i].val == NULL) {
			continue;
		}
		index = old_entries[i].key & (new_cap - 1);
		for (;;) {
			// Increment the load unconditionally.  It counts
			// once for every item stored, plus once for each
			// hashing operation we use to store the item (i.e.
			// one for the item, plus once for each rehash.)
			m->id_load++;
			if (new_entries[index].val == NULL) {
				// As we are hitting this entry for the first
				// time, it won't have any skips.
				NNI_ASSERT(new_entries[index].skips == 0);
				new_entries[index].val = old_entries[i].val;
				new_entries[index].key = old_entries[i].key;
				break;
			}
			new_entries[index].skips++;
			index = ID_NEXT(m, index);
		}
	}
	if (old_cap != 0) {
		NNI_FREE_STRUCTS(old_entries, old_cap);
	}
	return (0);
}